

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-file.c
# Opt level: O0

void lwsac_use_cached_file_end(lwsac_cached_file_t *cache)

{
  long lVar1;
  int iVar2;
  lwsac_head *lachead;
  lwsac *lac;
  lwsac_cached_file_t *cache_local;
  
  if ((cache != (lwsac_cached_file_t *)0x0) && (*cache != (lwsac_cached_file_t)0x0)) {
    lachead = (lwsac_head *)(*cache + -0xd8);
    lVar1 = *(long *)(*cache + -0xd0);
    lac = (lwsac *)cache;
    if (*(int *)(lVar1 + 0x30) == 0) {
      _lws_log(1,"%s: html refcount zero on entry\n","lwsac_use_cached_file_end");
    }
    if (((*(int *)(lVar1 + 0x30) != 0) &&
        (iVar2 = *(int *)(lVar1 + 0x30) + -1, *(int *)(lVar1 + 0x30) = iVar2, iVar2 == 0)) &&
       (*(char *)(lVar1 + 0x38) != '\0')) {
      lac->next = (lwsac *)0x0;
      lwsac_free((lwsac **)&lachead);
    }
  }
  return;
}

Assistant:

void
lwsac_use_cached_file_end(lwsac_cached_file_t *cache)
{
	struct lwsac *lac;
	struct lwsac_head *lachead;

	if (!cache || !*cache)
		return;

	lac = cache_file_to_lac(*cache);
	lachead = (struct lwsac_head *)&lac->head[1];

	if (!lachead->refcount)
		lwsl_err("%s: html refcount zero on entry\n", __func__);

	if (lachead->refcount && !--lachead->refcount && lachead->detached) {
		*cache = NULL; /* not usable any more */
		lwsac_free(&lac);
	}
}